

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O2

void __thiscall
RandomForest::ORForest<double>::Train
          (ORForest<double> *this,double *i_trainData,int i_Ns,int i_Nfp1)

{
  value_type vVar1;
  vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  *__p;
  vector<double,_std::allocator<double>_> *__p_00;
  reference pvVar2;
  __shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2> *this_00;
  int j;
  size_type __n;
  size_type __n_00;
  size_type sVar3;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> tempSample;
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  tempTrainData;
  __shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  
  __p = (vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
         *)operator_new(0x18);
  (__p->
  super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->
  super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __shared_ptr<std::vector<std::shared_ptr<std::vector<double,std::allocator<double>>>,std::allocator<std::shared_ptr<std::vector<double,std::allocator<double>>>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::vector<std::shared_ptr<std::vector<double,std::allocator<double>>>,std::allocator<std::shared_ptr<std::vector<double,std::allocator<double>>>>>,void>
            ((__shared_ptr<std::vector<std::shared_ptr<std::vector<double,std::allocator<double>>>,std::allocator<std::shared_ptr<std::vector<double,std::allocator<double>>>>>,(__gnu_cxx::_Lock_policy)2>
              *)&tempTrainData,__p);
  std::
  vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
  ::resize(tempTrainData.
           super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr,(long)i_Ns);
  __n_00 = 0;
  sVar3 = 0;
  if (0 < i_Nfp1) {
    sVar3 = (size_type)(uint)i_Nfp1;
  }
  if (i_Ns < 1) {
    i_Ns = 0;
  }
  for (; __n_00 != (uint)i_Ns; __n_00 = __n_00 + 1) {
    __p_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    (__p_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__p_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__p_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__shared_ptr<std::vector<double,std::allocator<double>>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::vector<double,std::allocator<double>>,void>
              ((__shared_ptr<std::vector<double,std::allocator<double>>,(__gnu_cxx::_Lock_policy)2>
                *)&tempSample.
                   super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
               ,__p_00);
    std::vector<double,_std::allocator<double>_>::resize
              (tempSample.
               super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(long)i_Nfp1);
    for (__n = 0; sVar3 != __n; __n = __n + 1) {
      vVar1 = i_trainData[__n];
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (tempSample.
                          super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,__n);
      *pvVar2 = vVar1;
    }
    this_00 = &std::
               vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
               ::at(tempTrainData.
                    super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,__n_00)->
               super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::__shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(this_00,&tempSample.
                       super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
             );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tempSample.
                super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    i_trainData = i_trainData + i_Nfp1;
  }
  std::
  __shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_40,
                 &tempTrainData.
                  super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  Train(this,(shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tempTrainData.
              super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void RandomForest::ORForest<T>::Train(const T *i_trainData, int i_Ns, int i_Nfp1)
{
    std::shared_ptr<std::vector<std::shared_ptr<std::vector<T> > > > tempTrainData(new std::vector<std::shared_ptr<std::vector<T> > >);
    tempTrainData->resize(i_Ns);
    for (int i=0; i<i_Ns; i++)
    {
        std::shared_ptr<std::vector<T> > tempSample(new std::vector<T>);
        tempSample->resize(i_Nfp1);
        for (int j=0; j<i_Nfp1; j++)
        {
            tempSample->at(j)=*(i_trainData+i*i_Nfp1+j);
        }
        tempTrainData->at(i)=tempSample;
    }
    Train(tempTrainData);
}